

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void vkt::BindingModel::anon_unknown_1::ImageFetchRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkImageView viewA,VkImageView viewB,
               VkDescriptorSet descriptorSet,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  VkImageLayout layout_00;
  size_t sVar2;
  size_type sVar3;
  Handle<(vk::HandleType)32> *pHVar4;
  deUint8 *pdVar5;
  Move<vk::Handle<(vk::HandleType)32>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)32>_> local_1c8;
  VkDescriptorUpdateTemplateEntryKHR local_1a8;
  VkDescriptorUpdateTemplateEntryKHR local_188;
  VkDescriptorUpdateTemplateEntryKHR local_168;
  VkDescriptorUpdateTemplateEntryKHR local_148;
  deUint64 local_128;
  deUint64 local_110;
  undefined1 local_108 [8];
  VkDescriptorImageInfo imageInfos [2];
  undefined1 local_c8 [4];
  VkImageLayout imageLayout;
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  bool withPush_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSet descriptorSet_local;
  VkImageView viewB_local;
  VkImageView viewA_local;
  VkDescriptorPool pool_local;
  VkDescriptorSetLayout layout_local;
  
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&templateCreateInfo.set);
  local_c8 = (undefined1  [4])0x3b9c1608;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = withPush & 1;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 0;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  templateCreateInfo._32_8_ = layout.m_internal;
  layout_00 = getImageLayoutForDescriptorType(descriptorType);
  local_110 = viewA.m_internal;
  makeDescriptorImageInfo((VkDescriptorImageInfo *)local_108,viewA,layout_00);
  local_128 = viewB.m_internal;
  makeDescriptorImageInfo((VkDescriptorImageInfo *)&imageInfos[0].imageLayout,viewB,layout_00);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (updateRegistry,(VkDescriptorImageInfo *)local_108);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (updateRegistry,(VkDescriptorImageInfo *)&imageInfos[0].imageLayout);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_148,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_148);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_168,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_168);
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,1);
    createTemplateBinding(&local_188,1,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_188);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_1a8,0,0,2,descriptorType,sVar2,0x18);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_1a8);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&templateCreateInfo.set,0);
  sVar3 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&templateCreateInfo.set);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar3;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_1e8,vki,device,(VkDescriptorUpdateTemplateCreateInfoKHR *)local_c8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data.deleter.m_deviceIface = local_1c8.deleter.m_deviceIface;
  data.object.m_internal = local_1c8.object.m_internal;
  data.deleter.m_device = local_1c8.deleter.m_device;
  data.deleter.m_allocator = local_1c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_1e8);
  if (!withPush) {
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar1 = pHVar4->m_internal;
    pdVar5 = RawUpdateRegistry::getRawPointer(updateRegistry);
    (*vki->_vptr_DeviceInterface[0x92])(vki,device,descriptorSet.m_internal,dVar1,pdVar5);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&templateCreateInfo.set);
  return;
}

Assistant:

void ImageFetchRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&					vki,
															   vk::VkDevice									device,
															   vk::VkDescriptorType							descriptorType,
															   ShaderInputInterface							shaderInterface,
															   vk::VkDescriptorSetLayout					layout,
															   vk::VkDescriptorPool							pool,
															   vk::VkImageView								viewA,
															   vk::VkImageView								viewB,
															   vk::VkDescriptorSet							descriptorSet,
															   vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
															   RawUpdateRegistry&							updateRegistry,
															   bool											withPush,
															   vk::VkPipelineLayout							pipelineLayout)
{
	DE_UNREF(pool);
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	const vk::VkImageLayout									imageLayout			= getImageLayoutForDescriptorType(descriptorType);
	const vk::VkDescriptorImageInfo							imageInfos[2]		=
	{
		makeDescriptorImageInfo(viewA, imageLayout),
		makeDescriptorImageInfo(viewB, imageLayout),
	};
	updateRegistry.addWriteObject(imageInfos[0]);
	updateRegistry.addWriteObject(imageInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(imageInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}